

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_4,_4> *
deqp::gles3::Functional::MatrixCaseUtils::inverse<4>
          (Matrix<float,_4,_4> *__return_storage_ptr__,Matrix<float,_4,_4> *mat)

{
  Vector<float,_4> *pVVar1;
  int row;
  float *pfVar2;
  float *pfVar3;
  undefined8 *puVar4;
  long lVar5;
  int col_5;
  int col_4;
  long lVar6;
  Matrix<float,_2,_2> *pMVar7;
  Matrix<float,_2,_2> *a;
  bool bVar8;
  Matrix<float,_2,_2> blockD;
  Matrix<float,_2,_2> blockC;
  Matrix<float,_2,_2> blockB;
  Matrix<float,_2,_2> blockA;
  Matrix<float,_2,_2> invA;
  float result [16];
  Matrix<float,_2,_2> zeroMat;
  float areaD [4];
  float areaC [4];
  float areaB [4];
  Matrix<float,_2,_2> matC;
  Matrix<float,_2,_2> matB;
  Matrix<float,_2,_2> schurComplement;
  Matrix<float,_2,_2> matD;
  float nullField [4];
  float areaA [4];
  Matrix<float,_2,_2> local_158;
  Matrix<float,_2,_2> local_148;
  Matrix<float,_2,_2> local_138;
  Matrix<float,_2,_2> local_128;
  Matrix<float,_2,_2> local_118;
  Matrix<float,_2,_2> local_108;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  Matrix<float,_2,_2> local_c8;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  Matrix<float,_2,_2> local_88;
  Matrix<float,_2,_2> local_78;
  Matrix<float,_2,_2> local_68;
  Matrix<float,_2,_2> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  pMVar7 = &local_158;
  pfVar2 = &local_38;
  local_38 = (mat->m_data).m_data[0].m_data[0];
  local_34 = (mat->m_data).m_data[1].m_data[0];
  local_30 = (mat->m_data).m_data[0].m_data[1];
  local_2c = (mat->m_data).m_data[1].m_data[1];
  local_98 = (mat->m_data).m_data[2].m_data[0];
  local_94 = (mat->m_data).m_data[3].m_data[0];
  local_90 = (mat->m_data).m_data[2].m_data[1];
  local_8c = (mat->m_data).m_data[3].m_data[1];
  local_a8 = (mat->m_data).m_data[0].m_data[2];
  local_a4 = (mat->m_data).m_data[1].m_data[2];
  local_a0 = (mat->m_data).m_data[0].m_data[3];
  local_9c = (mat->m_data).m_data[1].m_data[3];
  local_b8 = (mat->m_data).m_data[2].m_data[2];
  local_b4 = (mat->m_data).m_data[3].m_data[2];
  local_b0 = (mat->m_data).m_data[2].m_data[3];
  local_ac = (mat->m_data).m_data[3].m_data[3];
  local_48 = 0;
  uStack_40 = 0;
  pfVar3 = (float *)&local_108;
  local_108.m_data.m_data[0].m_data[0] = 0.0;
  local_108.m_data.m_data[0].m_data[1] = 0.0;
  local_108.m_data.m_data[1].m_data[0] = 0.0;
  local_108.m_data.m_data[1].m_data[1] = 0.0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar3[lVar6 * 2] = pfVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar2 = pfVar2 + 2;
    pfVar3 = pfVar3 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  inverse<2>(&local_108);
  pfVar3 = (float *)&local_78;
  local_78.m_data.m_data[0].m_data[0] = 0.0;
  local_78.m_data.m_data[0].m_data[1] = 0.0;
  local_78.m_data.m_data[1].m_data[0] = 0.0;
  local_78.m_data.m_data[1].m_data[1] = 0.0;
  pfVar2 = &local_98;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar3[lVar6 * 2] = pfVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar2 = pfVar2 + 2;
    pfVar3 = pfVar3 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  pfVar3 = (float *)&local_88;
  local_88.m_data.m_data[0].m_data[0] = 0.0;
  local_88.m_data.m_data[0].m_data[1] = 0.0;
  local_88.m_data.m_data[1].m_data[0] = 0.0;
  local_88.m_data.m_data[1].m_data[1] = 0.0;
  pfVar2 = &local_a8;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar3[lVar6 * 2] = pfVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar2 = pfVar2 + 2;
    pfVar3 = pfVar3 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  pfVar3 = (float *)&local_58;
  local_58.m_data.m_data[0].m_data[0] = 0.0;
  local_58.m_data.m_data[0].m_data[1] = 0.0;
  local_58.m_data.m_data[1].m_data[0] = 0.0;
  local_58.m_data.m_data[1].m_data[1] = 0.0;
  pfVar2 = &local_b8;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar3[lVar6 * 2] = pfVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar2 = pfVar2 + 2;
    pfVar3 = pfVar3 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  tcu::operator*((tcu *)&local_128,&local_88,&local_118);
  tcu::operator*((tcu *)&local_c8,&local_128,&local_78);
  pfVar3 = (float *)&local_c8;
  tcu::operator-((tcu *)&local_108,&local_58,(Matrix<float,_2,_2> *)pfVar3);
  inverse<2>(&local_108);
  local_c8.m_data.m_data[0].m_data[0] = 0.0;
  local_c8.m_data.m_data[0].m_data[1] = 0.0;
  local_c8.m_data.m_data[1].m_data[0] = 0.0;
  local_c8.m_data.m_data[1].m_data[1] = 0.0;
  puVar4 = &local_48;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar3[lVar6 * 2] = *(float *)((long)puVar4 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    puVar4 = puVar4 + 1;
    pfVar3 = pfVar3 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  tcu::operator*((tcu *)&local_158,&local_118,&local_78);
  tcu::operator*((tcu *)&local_148,&local_158,&local_68);
  tcu::operator*((tcu *)&local_138,&local_148,&local_88);
  tcu::operator*((tcu *)&local_108,&local_138,&local_118);
  tcu::operator+((tcu *)&local_128,&local_118,&local_108);
  tcu::operator-((tcu *)&local_148,&local_c8,&local_118);
  tcu::operator*((tcu *)&local_108,&local_148,&local_78);
  tcu::operator*((tcu *)&local_138,&local_108,&local_68);
  pfVar3 = (float *)&local_68;
  tcu::operator-((tcu *)&local_158,&local_c8,(Matrix<float,_2,_2> *)pfVar3);
  tcu::operator*((tcu *)&local_108,&local_158,&local_88);
  a = &local_108;
  tcu::operator*((tcu *)&local_148,a,&local_118);
  local_158.m_data.m_data[0].m_data[0] = 0.0;
  local_158.m_data.m_data[0].m_data[1] = 0.0;
  local_158.m_data.m_data[1].m_data[0] = 0.0;
  local_158.m_data.m_data[1].m_data[1] = 0.0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      *(float *)((long)pMVar7 + lVar6 * 8) = pfVar3[lVar6 * 2];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pMVar7 = (Matrix<float,_2,_2> *)((long)pMVar7 + 4);
    pfVar3 = pfVar3 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  local_f8 = local_128.m_data.m_data[0].m_data[1];
  local_f4 = local_128.m_data.m_data[1].m_data[1];
  local_f0 = local_138.m_data.m_data[0].m_data[1];
  local_ec = local_138.m_data.m_data[1].m_data[1];
  local_e8 = local_148.m_data.m_data[0].m_data[0];
  local_e4 = local_148.m_data.m_data[1].m_data[0];
  local_e0 = local_158.m_data.m_data[0].m_data[0];
  local_dc = local_158.m_data.m_data[1].m_data[0];
  local_d8 = local_148.m_data.m_data[0].m_data[1];
  local_d4 = local_148.m_data.m_data[1].m_data[1];
  local_d0 = local_158.m_data.m_data[0].m_data[1];
  local_cc = local_158.m_data.m_data[1].m_data[1];
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[3].m_data[2] = 0.0;
  pVVar1[3].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  lVar5 = 0;
  pfVar3 = (float *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      pfVar3[lVar6] = *(float *)((long)(a->m_data).m_data[0].m_data + lVar6);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    lVar5 = lVar5 + 1;
    a = a + 1;
    pfVar3 = pfVar3 + 1;
  } while (lVar5 != 4);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<float, 4, 4> inverse<4> (const tcu::Matrix<float, 4, 4>& mat)
{
	// Blockwise inversion

	DE_ASSERT(determinant(mat) != 0.0f);

	const float areaA[2*2] =
	{
		mat(0,0),	mat(0,1),
		mat(1,0),	mat(1,1)
	};
	const float areaB[2*2] =
	{
		mat(0,2),	mat(0,3),
		mat(1,2),	mat(1,3)
	};
	const float areaC[2*2] =
	{
		mat(2,0),	mat(2,1),
		mat(3,0),	mat(3,1)
	};
	const float areaD[2*2] =
	{
		mat(2,2),	mat(2,3),
		mat(3,2),	mat(3,3)
	};
	const float nullField[4] = { 0.0f };

	const tcu::Matrix<float, 2, 2> invA = inverse(Mat2(areaA));
	const tcu::Matrix<float, 2, 2> matB =         Mat2(areaB);
	const tcu::Matrix<float, 2, 2> matC =         Mat2(areaC);
	const tcu::Matrix<float, 2, 2> matD =         Mat2(areaD);

	const tcu::Matrix<float, 2, 2> schurComplement = inverse(matD - matC*invA*matB);
	const tcu::Matrix<float, 2, 2> zeroMat         = Mat2(nullField);

	const tcu::Matrix<float, 2, 2> blockA = invA + invA*matB*schurComplement*matC*invA;
	const tcu::Matrix<float, 2, 2> blockB = (zeroMat-invA)*matB*schurComplement;
	const tcu::Matrix<float, 2, 2> blockC = (zeroMat-schurComplement)*matC*invA;
	const tcu::Matrix<float, 2, 2> blockD = schurComplement;

	const float result[4*4] =
	{
		blockA(0,0),	blockA(0,1),	blockB(0,0),	blockB(0,1),
		blockA(1,0),	blockA(1,1),	blockB(1,0),	blockB(1,1),
		blockC(0,0),	blockC(0,1),	blockD(0,0),	blockD(0,1),
		blockC(1,0),	blockC(1,1),	blockD(1,0),	blockD(1,1),
	};

	return Mat4(result);
}